

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBoxShape.h
# Opt level: O0

void __thiscall
btBoxShape::getPreferredPenetrationDirection
          (btBoxShape *this,int index,btVector3 *penetrationVector)

{
  btVector3 *in_RDX;
  undefined4 in_ESI;
  btScalar local_60;
  btScalar local_5c;
  btScalar local_58;
  btScalar local_54;
  btScalar local_50;
  btScalar local_4c;
  btScalar local_48;
  btScalar local_44;
  btScalar local_40;
  btScalar local_3c;
  btScalar local_38;
  btScalar local_34;
  btScalar local_30;
  btScalar local_2c;
  btScalar local_28;
  btScalar local_24;
  btScalar local_20;
  btScalar local_1c [7];
  
  switch(in_ESI) {
  case 0:
    local_1c[0] = 1.0;
    local_20 = 0.0;
    local_24 = 0.0;
    btVector3::setValue(in_RDX,local_1c,&local_20,&local_24);
    break;
  case 1:
    local_28 = -1.0;
    local_2c = 0.0;
    local_30 = 0.0;
    btVector3::setValue(in_RDX,&local_28,&local_2c,&local_30);
    break;
  case 2:
    local_34 = 0.0;
    local_38 = 1.0;
    local_3c = 0.0;
    btVector3::setValue(in_RDX,&local_34,&local_38,&local_3c);
    break;
  case 3:
    local_40 = 0.0;
    local_44 = -1.0;
    local_48 = 0.0;
    btVector3::setValue(in_RDX,&local_40,&local_44,&local_48);
    break;
  case 4:
    local_4c = 0.0;
    local_50 = 0.0;
    local_54 = 1.0;
    btVector3::setValue(in_RDX,&local_4c,&local_50,&local_54);
    break;
  case 5:
    local_58 = 0.0;
    local_5c = 0.0;
    local_60 = -1.0;
    btVector3::setValue(in_RDX,&local_58,&local_5c,&local_60);
  }
  return;
}

Assistant:

virtual void	getPreferredPenetrationDirection(int index, btVector3& penetrationVector) const
	{
		switch (index)
		{
		case 0:
			penetrationVector.setValue(btScalar(1.),btScalar(0.),btScalar(0.));
			break;
		case 1:
			penetrationVector.setValue(btScalar(-1.),btScalar(0.),btScalar(0.));
			break;
		case 2:
			penetrationVector.setValue(btScalar(0.),btScalar(1.),btScalar(0.));
			break;
		case 3:
			penetrationVector.setValue(btScalar(0.),btScalar(-1.),btScalar(0.));
			break;
		case 4:
			penetrationVector.setValue(btScalar(0.),btScalar(0.),btScalar(1.));
			break;
		case 5:
			penetrationVector.setValue(btScalar(0.),btScalar(0.),btScalar(-1.));
			break;
		default:
			btAssert(0);
		}
	}